

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall
QtPrivate::BindingStatusOrList::removeObject(BindingStatusOrList *this,QObject *object)

{
  ulong uVar1;
  __normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_> __first;
  vector<QObject_*,_std::allocator<QObject_*>_> *this_00;
  long in_FS_OFFSET;
  QObject *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->data).super___atomic_base<unsigned_long_long>._M_i;
  this_00 = (vector<QObject_*,_std::allocator<QObject_*>_> *)(uVar1 & 0xfffffffffffffffe);
  local_18 = object;
  if (this_00 != (vector<QObject_*,_std::allocator<QObject_*>_> *)0x0 && (uVar1 & 1) != 0) {
    __first = std::
              __remove_if<__gnu_cxx::__normal_iterator<QObject**,std::vector<QObject*,std::allocator<QObject*>>>,__gnu_cxx::__ops::_Iter_equals_val<QObject*const>>
                        ((__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                          )(this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<QObject_**,_std::vector<QObject_*,_std::allocator<QObject_*>_>_>
                          )(this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish,&local_18);
    std::vector<QObject_*,_std::allocator<QObject_*>_>::erase
              (this_00,(const_iterator)__first._M_current,
               (const_iterator)
               (this_00->super__Vector_base<QObject_*,_std::allocator<QObject_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QtPrivate::BindingStatusOrList::removeObject(QObject *object)
{
    List *objectList = list();
    if (!objectList)
        return;
    auto it = std::remove(objectList->begin(), objectList->end(), object);
    objectList->erase(it, objectList->end());
}